

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Steiner.cpp
# Opt level: O2

string * getFileName(string *__return_storage_ptr__,string *filePathName,bool getFile)

{
  long lVar1;
  string asStack_38 [32];
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)filePathName);
  lVar1 = std::__cxx11::string::rfind((char *)__return_storage_ptr__,0x10d367);
  if (lVar1 != -1) {
    if (getFile) {
      std::__cxx11::string::substr((ulong)asStack_38,(ulong)__return_storage_ptr__);
    }
    else {
      std::__cxx11::string::substr((ulong)asStack_38,(ulong)__return_storage_ptr__);
    }
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,asStack_38);
    std::__cxx11::string::~string(asStack_38);
  }
  return __return_storage_ptr__;
}

Assistant:

inline string getFileName(const string& filePathName, bool getFile) {
  string retStr = filePathName;
  string::size_type pos = retStr.rfind("/");
  if (pos != string::npos) {
    if (getFile) retStr = retStr.substr(pos + 1);
    else retStr = retStr.substr(0, pos);
  }
  return retStr;
}